

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string_view name,Symbol symbol)

{
  ctrl_t *pcVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  bool bVar39;
  ushort uVar40;
  int iVar41;
  Symbol *key;
  CommonFields *common;
  ctrl_t *pcVar42;
  slot_type *psVar43;
  ctrl_t *pcVar44;
  size_t sVar45;
  SymbolByParentHash *this_00;
  anon_union_8_1_a8a14541_for_iterator_2 aVar46;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RAX;
  Nonnull<const_char_*> pcVar47;
  ulong uVar48;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  Symbol *b;
  Symbol *b_00;
  Symbol *b_01;
  Symbol *b_02;
  Symbol *pSVar49;
  SymbolByParentHash *s;
  PolicyFunctions *in_R9;
  undefined1 *unaff_R12;
  size_t cap;
  ulong uVar50;
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  iterator iVar56;
  iterator iVar57;
  iterator iVar58;
  FindInfo target;
  __m128i match;
  __m128i match_1;
  ulong local_100;
  ctrl_t *local_f8;
  Symbol local_e8;
  ctrl_t *local_e0;
  anon_union_8_1_a8a14541_for_iterator_2 local_d8;
  uint local_cc;
  undefined1 local_c8 [16];
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  anon_union_8_1_a8a14541_for_iterator_2 local_a0;
  anon_union_8_1_a8a14541_for_iterator_2 local_98;
  void *local_90;
  ctrl_t local_88;
  ctrl_t cStack_87;
  ctrl_t cStack_86;
  ctrl_t cStack_85;
  ctrl_t cStack_84;
  ctrl_t cStack_83;
  ctrl_t cStack_82;
  ctrl_t cStack_81;
  ctrl_t cStack_80;
  ctrl_t cStack_7f;
  ctrl_t cStack_7e;
  ctrl_t cStack_7d;
  ctrl_t cStack_7c;
  ctrl_t cStack_7b;
  ctrl_t cStack_7a;
  ctrl_t cStack_79;
  anon_union_8_1_a8a14541_for_iterator_2 local_78;
  ctrl_t *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  anon_union_8_1_a8a14541_for_iterator_2 local_50;
  anon_union_8_1_a8a14541_for_iterator_2 local_48;
  const_iterator local_40;
  
  local_b0._M_str = name._M_str;
  local_b0._M_len = name._M_len;
  local_e8.ptr_ = symbol.ptr_;
  Symbol::parent_name_key
            ((pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_a0
             ,&local_e8);
  if (((slot_type *)local_b0._M_len == local_98.slot_) &&
     (((slot_type *)local_b0._M_len == (slot_type *)0x0 ||
      (iVar41 = bcmp(local_b0._M_str,local_90,local_b0._M_len), iVar41 == 0)))) {
    pcVar47 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar47 = absl::lts_20250127::log_internal::
              MakeCheckOpString<std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&>
                        (&local_b0,(basic_string_view<char,_std::char_traits<char>_> *)&local_98,
                         "name == symbol.parent_name_key().second");
  }
  if (pcVar47 == (Nonnull<const_char_*>)0x0) {
    Symbol::parent_name_key
              ((pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
               &local_a0,&local_e8);
    if (local_a0.slot_ == (slot_type *)parent) {
      pcVar47 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar47 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                          (parent,local_a0.slot_,"parent == symbol.parent_name_key().first");
    }
    if (pcVar47 == (Nonnull<const_char_*>)0x0) {
      pSVar49 = &local_e8;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertOnFind<google::protobuf::Symbol>
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)this,pSVar49);
      lVar2 = (this->symbols_by_parent_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
      if (lVar2 == 1) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
        if ((this->symbols_by_parent_).
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_ < 2) {
          lVar2 = (this->symbols_by_parent_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_;
          if (lVar2 != 1) {
            if (lVar2 != 0) {
              __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xe3f,
                            "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                           );
            }
            goto LAB_00209c28;
          }
          absl::lts_20250127::container_internal::CommonFields::AssertInSooMode
                    ((CommonFields *)this);
          (this->symbols_by_parent_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_ = 2;
          aVar46.slot_ = absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                     *)this);
          iVar57.field_1.slot_ = aVar46.slot_;
          iVar57.ctrl_ = (ctrl_t *)aVar46;
          unaff_R12 = absl::lts_20250127::container_internal::kSooControl;
        }
        else {
          psVar43 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
          bVar39 = protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
                             (psVar43,&local_e8,b_00);
          if (bVar39) {
            aVar46.slot_ = absl::lts_20250127::container_internal::
                           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                       *)this);
            iVar58.field_1.slot_ = aVar46.slot_;
            iVar58.ctrl_ = (ctrl_t *)aVar46;
            unaff_R12 = absl::lts_20250127::container_internal::kSooControl;
LAB_002098f5:
            aVar46 = iVar58.field_1;
            uVar50 = 0;
            goto LAB_00209930;
          }
          pSVar49 = (Symbol *)0x3;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::resize_impl(this);
          sVar45 = protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
                             ((SymbolByParentHash *)&local_e8,pSVar49);
          sVar45 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                             (sVar45,8,(CommonFields *)this);
          iVar57 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                  *)this,sVar45);
          unaff_R12 = iVar57.ctrl_;
        }
        aVar46 = iVar57.field_1;
        uVar50 = CONCAT71(iVar57.ctrl_._1_7_,1);
      }
      else {
        if (lVar2 == 0) goto LAB_00209c28;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::prefetch_heap_block
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
        common = (CommonFields *)
                 protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
                           ((SymbolByParentHash *)&local_e8,pSVar49);
        uVar3 = (this->symbols_by_parent_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_;
        if ((uVar3 + 1 & uVar3) != 0) goto LAB_00209c04;
        uVar48 = ((ulong)common >> 7 ^
                 (ulong)(this->symbols_by_parent_).
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_.heap.control >> 0xc) & uVar3;
        pcVar42 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                             *)this);
        auVar52 = ZEXT216(CONCAT11((char)common,(char)common) & 0x7f7f);
        auVar52 = pshuflw(auVar52,auVar52,0);
        local_c8._0_4_ = auVar52._0_4_;
        local_c8._4_4_ = local_c8._0_4_;
        local_c8._8_4_ = local_c8._0_4_;
        local_c8._12_4_ = local_c8._0_4_;
        local_f8 = (ctrl_t *)0x0;
        aVar46 = extraout_RDX;
        do {
          pcVar1 = pcVar42 + uVar48;
          auVar52[0] = -(local_c8[0] == *pcVar1);
          auVar52[1] = -(local_c8[1] == pcVar1[1]);
          auVar52[2] = -(local_c8[2] == pcVar1[2]);
          auVar52[3] = -(local_c8[3] == pcVar1[3]);
          auVar52[4] = -(local_c8[4] == pcVar1[4]);
          auVar52[5] = -(local_c8[5] == pcVar1[5]);
          auVar52[6] = -(local_c8[6] == pcVar1[6]);
          auVar52[7] = -(local_c8[7] == pcVar1[7]);
          auVar52[8] = -(local_c8[8] == pcVar1[8]);
          auVar52[9] = -(local_c8[9] == pcVar1[9]);
          auVar52[10] = -(local_c8[10] == pcVar1[10]);
          auVar52[0xb] = -(local_c8[0xb] == pcVar1[0xb]);
          auVar52[0xc] = -(local_c8[0xc] == pcVar1[0xc]);
          auVar52[0xd] = -(local_c8[0xd] == pcVar1[0xd]);
          auVar52[0xe] = -(local_c8[0xe] == pcVar1[0xe]);
          auVar52[0xf] = -(local_c8[0xf] == pcVar1[0xf]);
          uVar40 = (ushort)(SUB161(auVar52 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar52[0xf] >> 7) << 0xf;
          uVar51 = (uint)uVar40;
          cVar23 = *pcVar1;
          cVar24 = pcVar1[1];
          cVar25 = pcVar1[2];
          cVar26 = pcVar1[3];
          cVar27 = pcVar1[4];
          cVar28 = pcVar1[5];
          cVar29 = pcVar1[6];
          cVar30 = pcVar1[7];
          cVar31 = pcVar1[8];
          cVar32 = pcVar1[9];
          cVar33 = pcVar1[10];
          cVar34 = pcVar1[0xb];
          cVar35 = pcVar1[0xc];
          cVar36 = pcVar1[0xd];
          cVar37 = pcVar1[0xe];
          cVar38 = pcVar1[0xf];
          cVar7 = local_88;
          cVar8 = cStack_87;
          cVar9 = cStack_86;
          cVar10 = cStack_85;
          cVar11 = cStack_84;
          cVar12 = cStack_83;
          cVar13 = cStack_82;
          cVar14 = cStack_81;
          cVar15 = cStack_80;
          cVar16 = cStack_7f;
          cVar17 = cStack_7e;
          cVar18 = cStack_7d;
          cVar19 = cStack_7c;
          cVar20 = cStack_7b;
          cVar21 = cStack_7a;
          cVar22 = cStack_79;
          while (cStack_79 = cVar38, cStack_7a = cVar37, cStack_7b = cVar36, cStack_7c = cVar35,
                cStack_7d = cVar34, cStack_7e = cVar33, cStack_7f = cVar32, cStack_80 = cVar31,
                cStack_81 = cVar30, cStack_82 = cVar29, cStack_83 = cVar28, cStack_84 = cVar27,
                cStack_85 = cVar26, cStack_86 = cVar25, cStack_87 = cVar24, local_88 = cVar23,
                uVar40 != 0) {
            uVar4 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            local_e0 = pcVar42;
            local_d8 = (anon_union_8_1_a8a14541_for_iterator_2)unaff_R12;
            psVar43 = absl::lts_20250127::container_internal::
                      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)this);
            uVar50 = uVar4 + uVar48 & uVar3;
            bVar39 = protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
                               (psVar43 + uVar50,&local_e8,b);
            if (bVar39) {
              iVar58 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                      *)this,uVar50);
              unaff_R12 = iVar58.ctrl_;
              goto LAB_002098f5;
            }
            uVar40 = (ushort)(uVar51 - 1) & (ushort)uVar51;
            uVar51 = CONCAT22((short)(uVar51 - 1 >> 0x10),uVar40);
            pcVar42 = local_e0;
            unaff_R12 = (undefined1 *)local_d8;
            cVar23 = local_88;
            cVar24 = cStack_87;
            cVar25 = cStack_86;
            cVar26 = cStack_85;
            cVar27 = cStack_84;
            cVar28 = cStack_83;
            cVar29 = cStack_82;
            cVar30 = cStack_81;
            cVar31 = cStack_80;
            cVar32 = cStack_7f;
            cVar33 = cStack_7e;
            cVar34 = cStack_7d;
            cVar35 = cStack_7c;
            cVar36 = cStack_7b;
            cVar37 = cStack_7a;
            cVar38 = cStack_79;
            cVar7 = local_88;
            cVar8 = cStack_87;
            cVar9 = cStack_86;
            cVar10 = cStack_85;
            cVar11 = cStack_84;
            cVar12 = cStack_83;
            cVar13 = cStack_82;
            cVar14 = cStack_81;
            cVar15 = cStack_80;
            cVar16 = cStack_7f;
            cVar17 = cStack_7e;
            cVar18 = cStack_7d;
            cVar19 = cStack_7c;
            cVar20 = cStack_7b;
            cVar21 = cStack_7a;
            cVar22 = cStack_79;
          }
          auVar55[0] = -(local_88 == kEmpty);
          auVar55[1] = -(cStack_87 == kEmpty);
          auVar55[2] = -(cStack_86 == kEmpty);
          auVar55[3] = -(cStack_85 == kEmpty);
          auVar55[4] = -(cStack_84 == kEmpty);
          auVar55[5] = -(cStack_83 == kEmpty);
          auVar55[6] = -(cStack_82 == kEmpty);
          auVar55[7] = -(cStack_81 == kEmpty);
          auVar55[8] = -(cStack_80 == kEmpty);
          auVar55[9] = -(cStack_7f == kEmpty);
          auVar55[10] = -(cStack_7e == kEmpty);
          auVar55[0xb] = -(cStack_7d == kEmpty);
          auVar55[0xc] = -(cStack_7c == kEmpty);
          auVar55[0xd] = -(cStack_7b == kEmpty);
          auVar55[0xe] = -(cStack_7a == kEmpty);
          auVar55[0xf] = -(cStack_79 == kEmpty);
          uVar40 = (ushort)(SUB161(auVar55 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar55[0xf] >> 7) << 0xf;
          pcVar1 = (ctrl_t *)
                   (this->symbols_by_parent_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
          local_88 = cVar7;
          cStack_87 = cVar8;
          cStack_86 = cVar9;
          cStack_85 = cVar10;
          cStack_84 = cVar11;
          cStack_83 = cVar12;
          cStack_82 = cVar13;
          cStack_81 = cVar14;
          cStack_80 = cVar15;
          cStack_7f = cVar16;
          cStack_7e = cVar17;
          cStack_7d = cVar18;
          cStack_7c = cVar19;
          cStack_7b = cVar20;
          cStack_7a = cVar21;
          cStack_79 = cVar22;
          if (uVar40 == 0) {
            if (pcVar1 == (ctrl_t *)0x0) goto LAB_00209c28;
            pcVar44 = local_f8 + 0x10;
            iVar56.field_1.slot_ = aVar46.slot_;
            iVar56.ctrl_ = pcVar44;
            if (pcVar1 < pcVar44) {
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xf7d,
                            "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                           );
            }
            uVar48 = (ulong)(local_f8 + uVar48 + 0x10) & uVar3;
            local_f8 = pcVar44;
          }
          else {
            if (pcVar1 == (ctrl_t *)0x0) goto LAB_00209c28;
            pcVar44 = absl::lts_20250127::container_internal::
                      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                 *)this);
            bVar39 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                               ((size_t)pcVar1,(size_t)common,pcVar44);
            if (bVar39) {
              uVar5 = 0xf;
              if (uVar40 != 0) {
                for (; uVar40 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar51 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
            }
            else {
              uVar51 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                }
              }
            }
            target.probe_length =
                 (size_t)absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>
                         ::GetPolicyFunctions()::value;
            target.offset = (size_t)local_f8;
            sVar45 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                               ((container_internal *)this,common,uVar51 + uVar48 & uVar3,target,
                                in_R9);
            iVar56 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)this,sVar45);
            unaff_R12 = iVar56.ctrl_;
          }
          aVar46 = iVar56.field_1;
          uVar50 = CONCAT71(iVar56.ctrl_._1_7_,1);
        } while (uVar40 == 0);
      }
LAB_00209930:
      if ((char)uVar50 == '\0') goto LAB_00209bc4;
      local_cc = (uint)uVar50;
      sVar45 = (this->symbols_by_parent_).
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      (this->symbols_by_parent_).
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 0xffffffffffffff9c;
      (aVar46.slot_)->ptr_ = local_e8.ptr_;
      local_a0 = (anon_union_8_1_a8a14541_for_iterator_2)unaff_R12;
      local_98 = aVar46;
      local_78 = aVar46;
      absl::lts_20250127::container_internal::CommonFields::set_capacity
                ((CommonFields *)this,sVar45);
      this_00 = (SymbolByParentHash *)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::iterator::operator*((iterator *)&local_a0);
      s = this_00;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertOnFind<google::protobuf::Symbol>
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)this,(Symbol *)this_00);
      lVar2 = (this->symbols_by_parent_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
      if (lVar2 == 1) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
        local_50 = (anon_union_8_1_a8a14541_for_iterator_2)unaff_R12;
        if (1 < (this->symbols_by_parent_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_) {
          psVar43 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
          bVar39 = protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
                             (psVar43,(Symbol *)this_00,b_02);
          if (bVar39) {
            aVar46.slot_ = absl::lts_20250127::container_internal::
                           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                       *)this);
            local_40.inner_.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
            goto LAB_00209b8d;
          }
        }
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
        local_40.inner_.ctrl_ = (ctrl_t *)0x0;
        aVar46 = extraout_RAX;
      }
      else {
        if (lVar2 == 0) {
LAB_00209c28:
          __assert_fail("cap >= kDefaultCapacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xb75,
                        "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                       );
        }
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::prefetch_heap_block
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
        sVar45 = protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
                           (this_00,(Symbol *)s);
        local_100 = (this->symbols_by_parent_).
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_;
        if (local_100 == 1) {
          __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xe2a,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                       );
        }
        if (local_100 == 0) goto LAB_00209c28;
        local_d8 = (anon_union_8_1_a8a14541_for_iterator_2)unaff_R12;
        if ((local_100 + 1 & local_100) != 0) goto LAB_00209c04;
        local_c8._0_8_ = local_100;
        local_100 = (sVar45 >> 7 ^
                    (ulong)(this->symbols_by_parent_).
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           .settings_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_.heap.control >> 0xc) & local_100;
        local_70 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                              *)this);
        local_40.inner_.ctrl_ = (ctrl_t *)(sVar45 & 0xffffffffffffff7f);
        auVar52 = ZEXT416((CONCAT11((char)sVar45,(char)sVar45) & 0xff7f) & 0xffff7fff);
        auVar52 = pshuflw(auVar52,auVar52,0);
        local_68 = auVar52._0_4_;
        pcVar42 = (ctrl_t *)0x0;
        aVar46 = (anon_union_8_1_a8a14541_for_iterator_2)unaff_R12;
        uStack_64 = local_68;
        uStack_60 = local_68;
        uStack_5c = local_68;
        do {
          pcVar1 = local_70 + local_100;
          local_88 = *pcVar1;
          cStack_87 = pcVar1[1];
          cStack_86 = pcVar1[2];
          cStack_85 = pcVar1[3];
          cStack_84 = pcVar1[4];
          cStack_83 = pcVar1[5];
          cStack_82 = pcVar1[6];
          cStack_81 = pcVar1[7];
          cStack_80 = pcVar1[8];
          cStack_7f = pcVar1[9];
          cStack_7e = pcVar1[10];
          cStack_7d = pcVar1[0xb];
          cStack_7c = pcVar1[0xc];
          cStack_7b = pcVar1[0xd];
          cStack_7a = pcVar1[0xe];
          cStack_79 = pcVar1[0xf];
          auVar53[0] = -((ctrl_t)local_68 == local_88);
          auVar53[1] = -(local_68._1_1_ == cStack_87);
          auVar53[2] = -(local_68._2_1_ == cStack_86);
          auVar53[3] = -(local_68._3_1_ == cStack_85);
          auVar53[4] = -((ctrl_t)uStack_64 == cStack_84);
          auVar53[5] = -(uStack_64._1_1_ == cStack_83);
          auVar53[6] = -(uStack_64._2_1_ == cStack_82);
          auVar53[7] = -(uStack_64._3_1_ == cStack_81);
          auVar53[8] = -((ctrl_t)uStack_60 == cStack_80);
          auVar53[9] = -(uStack_60._1_1_ == cStack_7f);
          auVar53[10] = -(uStack_60._2_1_ == cStack_7e);
          auVar53[0xb] = -(uStack_60._3_1_ == cStack_7d);
          auVar53[0xc] = -((ctrl_t)uStack_5c == cStack_7c);
          auVar53[0xd] = -(uStack_5c._1_1_ == cStack_7b);
          auVar53[0xe] = -(uStack_5c._2_1_ == cStack_7a);
          auVar53[0xf] = -(uStack_5c._3_1_ == cStack_79);
          uVar40 = (ushort)(SUB161(auVar53 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar53[0xf] >> 7) << 0xf;
          uVar51 = (uint)uVar40;
          local_e0 = pcVar42;
          while (uVar40 != 0) {
            uVar4 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            psVar43 = absl::lts_20250127::container_internal::
                      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)this);
            uVar50 = uVar4 + local_100 & local_c8._0_8_;
            bVar39 = protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
                               (psVar43 + uVar50,(Symbol *)this_00,b_01);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = aVar46;
            iVar58 = (iterator)(auVar6 << 0x40);
            if (bVar39) {
              iVar58 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                      *)this,uVar50);
              local_40.inner_.ctrl_ = iVar58.ctrl_;
            }
            aVar46 = iVar58.field_1;
            if (bVar39) break;
            uVar40 = (ushort)(uVar51 - 1) & (ushort)uVar51;
            uVar51 = CONCAT22((short)(uVar51 - 1 >> 0x10),uVar40);
          }
          if (uVar40 != 0) {
LAB_00209af2:
            bVar39 = false;
            pcVar42 = local_e0;
          }
          else {
            auVar54[0] = -(local_88 == kEmpty);
            auVar54[1] = -(cStack_87 == kEmpty);
            auVar54[2] = -(cStack_86 == kEmpty);
            auVar54[3] = -(cStack_85 == kEmpty);
            auVar54[4] = -(cStack_84 == kEmpty);
            auVar54[5] = -(cStack_83 == kEmpty);
            auVar54[6] = -(cStack_82 == kEmpty);
            auVar54[7] = -(cStack_81 == kEmpty);
            auVar54[8] = -(cStack_80 == kEmpty);
            auVar54[9] = -(cStack_7f == kEmpty);
            auVar54[10] = -(cStack_7e == kEmpty);
            auVar54[0xb] = -(cStack_7d == kEmpty);
            auVar54[0xc] = -(cStack_7c == kEmpty);
            auVar54[0xd] = -(cStack_7b == kEmpty);
            auVar54[0xe] = -(cStack_7a == kEmpty);
            auVar54[0xf] = -(cStack_79 == kEmpty);
            if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar54 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar54 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar54 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar54 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar54 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar54 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar54 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar54 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar54 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                cStack_79 == kEmpty) {
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::AssertNotDebugCapacity
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          *)this);
              local_40.inner_.ctrl_ = (ctrl_t *)0x0;
              goto LAB_00209af2;
            }
            pcVar1 = (ctrl_t *)
                     (this->symbols_by_parent_).
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.capacity_;
            if (pcVar1 == (ctrl_t *)0x0) goto LAB_00209c28;
            pcVar42 = local_e0 + 0x10;
            if (pcVar1 < pcVar42) {
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xe37,
                            "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                           );
            }
            local_100 = (ulong)(local_e0 + local_100 + 0x10) & local_c8._0_8_;
            bVar39 = true;
          }
          local_50 = local_d8;
        } while (bVar39);
      }
LAB_00209b8d:
      local_48 = local_78;
      local_40.inner_.field_1 = aVar46;
      bVar39 = absl::lts_20250127::container_internal::operator==
                         (&local_40,(const_iterator *)&local_50);
      if (!bVar39) {
        __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xfe2,
                      "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, Args = <const google::protobuf::Symbol &>]"
                     );
      }
      uVar50 = (ulong)local_cc;
LAB_00209bc4:
      return SUB81(uVar50,0);
    }
  }
  else {
    AddAliasUnderParent();
  }
  AddAliasUnderParent();
LAB_00209c04:
  __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x14c,
                "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               absl::string_view name,
                                               Symbol symbol) {
  ABSL_DCHECK_EQ(name, symbol.parent_name_key().second);
  ABSL_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}